

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O2

void __thiscall
cfd::core::AbstractTxOutReference::AbstractTxOutReference
          (AbstractTxOutReference *this,AbstractTxOutReference *param_1)

{
  bool bVar1;
  undefined7 uVar2;
  
  this->_vptr_AbstractTxOutReference = (_func_int **)&PTR__AbstractTxOutReference_006495e0;
  bVar1 = (param_1->value_).ignore_check_;
  uVar2 = *(undefined7 *)&(param_1->value_).field_0x9;
  (this->value_).amount_ = (param_1->value_).amount_;
  (this->value_).ignore_check_ = bVar1;
  *(undefined7 *)&(this->value_).field_0x9 = uVar2;
  Script::Script(&this->locking_script_,&param_1->locking_script_);
  return;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxOutReference {
 public:
  /**
   * @brief constructor.
   * @param[in] tx_out  TxOut instance to reference
   */
  explicit AbstractTxOutReference(const AbstractTxOut& tx_out);
  /**
   * @brief destructor
   */
  virtual ~AbstractTxOutReference() {
    // do nothing
  }

  /**
   * @brief Get an amount.
   * @return amount
   */
  const Amount GetValue() const { return value_; }

  /**
   * @brief Get a locking script.
   * @return locking script
   */
  const Script GetLockingScript() const { return locking_script_; }

  /**
   * @brief Get a serialized size.
   * @return serialized size
   */
  uint32_t GetSerializeSize() const;

  /**
   * @brief Get a serialized virtual size.
   * @return serialized virtual size.
   */
  uint32_t GetSerializeVsize() const;

 protected:
  Amount value_;           ///< amount
  Script locking_script_;  ///< locking script
}